

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormatT.cc
# Opt level: O2

size_t OpenMesh::IO::restore<unsigned_long>(istream *_is,ulong *_val,undefined4 _b,bool _swap)

{
  size_t sVar1;
  ulong local_28;
  uint64 v_2;
  uint32 v_1;
  uint16 v_3;
  uint8 v;
  
  switch(_b) {
  case 0:
    sVar1 = binary<unsigned_char>::restore(_is,(value_type *)((long)&v_2 + 7),_swap);
    local_28 = (ulong)v_2._7_1_;
    break;
  case 1:
    sVar1 = binary<unsigned_short>::restore(_is,(value_type *)((long)&v_2 + 4),_swap);
    local_28 = (ulong)v_2._4_2_;
    break;
  case 2:
    sVar1 = binary<unsigned_int>::restore(_is,(value_type *)&v_2,_swap);
    local_28 = (ulong)(uint)v_2;
    break;
  case 3:
    sVar1 = binary<unsigned_long_long>::restore(_is,&local_28,_swap);
    break;
  default:
    return 0;
  }
  *_val = local_28;
  return sVar1;
}

Assistant:

size_t 
  restore( std::istream& _is, 
	   T& _val, 
	   OMFormat::Chunk::Integer_Size _b, 
	   bool _swap,
	   t_unsigned)
  {    
    assert( OMFormat::is_integer( _val ) );
    size_t bytes = 0;

    switch( _b ) 
    {
      case OMFormat::Chunk::Integer_8:
      { 
	OMFormat::uint8 v;
	bytes = restore( _is, v, _swap );
	_val = static_cast<T>(v);
	break;
      }
      case OMFormat::Chunk::Integer_16:
      { 
	OMFormat::uint16 v;
	bytes = restore( _is, v, _swap );
	_val = static_cast<T>(v);
	break;
      }
      case OMFormat::Chunk::Integer_32:
      { 
	OMFormat::uint32 v;
	bytes = restore( _is, v, _swap );
	_val = static_cast<T>(v);
	break;
      }
      
      case OMFormat::Chunk::Integer_64:
      { 
	OMFormat::uint64 v;
	bytes = restore( _is, v, _swap );
	_val = static_cast<T>(v);
	break;
      }
    }
    return bytes;
  }